

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlChar * xmlDictExists(xmlDictPtr dict,xmlChar *name,int len)

{
  xmlChar *pxVar1;
  _xmlDict *p_Var2;
  bool bVar3;
  _xmlDictEntry *p_Var4;
  int iVar5;
  size_t sVar6;
  unsigned_long uVar7;
  uint uVar8;
  ulong uVar9;
  _xmlDictEntry *p_Var10;
  _xmlDictEntry *p_Var11;
  xmlChar *__s1;
  uint namelen;
  
  if (name == (xmlChar *)0x0 || dict == (xmlDictPtr)0x0) {
    return (xmlChar *)0x0;
  }
  sVar6 = (size_t)(uint)len;
  if (len < 0) {
    sVar6 = strlen((char *)name);
  }
  namelen = (uint)sVar6;
  if (dict->limit == 0) {
    if (0x3fffffff < namelen) {
      return (xmlChar *)0x0;
    }
  }
  else if (0x3fffffff < namelen || dict->limit <= (sVar6 & 0xffffffff)) {
    return (xmlChar *)0x0;
  }
  pxVar1 = (xmlChar *)dict->size;
  if (pxVar1 == (xmlChar *)0x80) {
    uVar7 = xmlDictComputeFastKey(name,namelen,dict->seed);
  }
  else if ((int)namelen < 1) {
    uVar7 = 0;
  }
  else {
    uVar8 = dict->seed;
    uVar9 = 0;
    do {
      uVar8 = (name[uVar9] + uVar8) * 0x401;
      uVar8 = uVar8 >> 6 ^ uVar8;
      uVar9 = uVar9 + 1;
    } while ((sVar6 & 0xffffffff) != uVar9);
    uVar7 = (unsigned_long)((uVar8 * 9 >> 0xb ^ uVar8 * 9) * 0x8001);
  }
  __s1 = pxVar1;
  if (dict->dict[uVar7 % (ulong)pxVar1].valid != 0) {
    p_Var11 = dict->dict + uVar7 % (ulong)pxVar1;
    if (p_Var11->next != (_xmlDictEntry *)0x0) {
      p_Var4 = p_Var11->next;
      p_Var10 = p_Var11;
      do {
        p_Var11 = p_Var4;
        if ((p_Var10->okey == uVar7) && (p_Var10->len == namelen)) {
          __s1 = p_Var10->name;
          iVar5 = bcmp(__s1,name,sVar6 & 0xffffffff);
          if (iVar5 == 0) {
            return __s1;
          }
        }
        p_Var4 = p_Var11->next;
        p_Var10 = p_Var11;
      } while (p_Var11->next != (_xmlDictEntry *)0x0);
    }
    if ((p_Var11->okey == uVar7) && (p_Var11->len == namelen)) {
      __s1 = p_Var11->name;
      iVar5 = bcmp(__s1,name,sVar6 & 0xffffffff);
      if (iVar5 == 0) {
        return __s1;
      }
    }
  }
  p_Var2 = dict->subdict;
  if (p_Var2 == (_xmlDict *)0x0) {
    return (xmlChar *)0x0;
  }
  if (pxVar1 == (xmlChar *)0x80) {
    if (p_Var2->size != 0x80) {
LAB_0014226b:
      if (p_Var2->size == 0x80) {
        uVar7 = xmlDictComputeFastKey(name,namelen,p_Var2->seed);
      }
      else if ((int)namelen < 1) {
        uVar7 = 0;
      }
      else {
        uVar8 = p_Var2->seed;
        uVar9 = 0;
        do {
          uVar8 = (name[uVar9] + uVar8) * 0x401;
          uVar8 = uVar8 >> 6 ^ uVar8;
          uVar9 = uVar9 + 1;
        } while ((sVar6 & 0xffffffff) != uVar9);
        uVar7 = (unsigned_long)((uVar8 * 9 >> 0xb ^ uVar8 * 9) * 0x8001);
      }
    }
  }
  else if (p_Var2->size == 0x80) goto LAB_0014226b;
  uVar9 = uVar7 % p_Var2->size;
  bVar3 = true;
  if (p_Var2->dict[uVar9].valid != 0) {
    p_Var11 = p_Var2->dict + uVar9;
    if (p_Var11->next != (_xmlDictEntry *)0x0) {
      p_Var4 = p_Var11->next;
      p_Var10 = p_Var11;
      do {
        p_Var11 = p_Var4;
        if ((p_Var10->okey == uVar7) && (p_Var10->len == namelen)) {
          __s1 = p_Var10->name;
          iVar5 = bcmp(__s1,name,sVar6 & 0xffffffff);
          if (iVar5 == 0) goto LAB_00142353;
        }
        p_Var4 = p_Var11->next;
        p_Var10 = p_Var11;
      } while (p_Var11->next != (_xmlDictEntry *)0x0);
    }
    if ((p_Var11->okey == uVar7) && (p_Var11->len == namelen)) {
      __s1 = p_Var11->name;
      iVar5 = bcmp(__s1,name,sVar6 & 0xffffffff);
      if (iVar5 == 0) {
LAB_00142353:
        bVar3 = false;
        goto LAB_00142355;
      }
    }
    bVar3 = true;
  }
LAB_00142355:
  if (bVar3) {
    return (xmlChar *)0x0;
  }
  return __s1;
}

Assistant:

const xmlChar *
xmlDictExists(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey;
    xmlDictEntryPtr insert;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;
    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
    }

    /* not found */
    return(NULL);
}